

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O2

SnapArrayInfoBlock<void_*> *
TTD::NSSnapObjects::AllocateArrayInfoBlock<void*,true>
          (SlabAllocator *alloc,uint32 firstIndex,uint32 lastIndex)

{
  SnapArrayInfoBlock<void_*> *pSVar1;
  void **ppvVar2;
  uchar *__s;
  ulong count;
  
  pSVar1 = (SnapArrayInfoBlock<void_*> *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<32ul>(alloc);
  pSVar1->FirstIndex = firstIndex;
  pSVar1->LastIndex = lastIndex;
  count = (ulong)(lastIndex - firstIndex);
  ppvVar2 = SlabAllocatorBase<0>::SlabAllocateArray<void*>(alloc,count);
  pSVar1->ArrayRangeContents = ppvVar2;
  __s = SlabAllocatorBase<0>::SlabAllocateArray<unsigned_char>(alloc,count);
  pSVar1->ArrayValidTags = __s;
  memset(__s,0,count);
  pSVar1->Next = (SnapArrayInfoBlock<void_*> *)0x0;
  return pSVar1;
}

Assistant:

SnapArrayInfoBlock<T>* AllocateArrayInfoBlock(SlabAllocator& alloc, uint32 firstIndex, uint32 lastIndex)
        {
            SnapArrayInfoBlock<T>* sai = alloc.SlabAllocateStruct< SnapArrayInfoBlock<T> >();
            sai->FirstIndex = firstIndex;
            sai->LastIndex = lastIndex;

            sai->ArrayRangeContents = alloc.SlabAllocateArray<T>(lastIndex - firstIndex);
            sai->ArrayValidTags = alloc.SlabAllocateArray<byte>(lastIndex - firstIndex);

            //only zero valid flags (which guard the contents values)
            if(zeroFillValid)
            {
                memset(sai->ArrayValidTags, 0, lastIndex - firstIndex);
            }

            sai->Next = nullptr;

            return sai;
        }